

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

bool __thiscall ExpressionContext::IsGenericFunction(ExpressionContext *this,FunctionData *function)

{
  TypeBase *pTVar1;
  bool bVar2;
  MatchData *pMVar3;
  
  bVar2 = true;
  if (((function->type->super_TypeBase).isGeneric == false) &&
     ((pTVar1 = function->scope->ownerType, pTVar1 == (TypeBase *)0x0 ||
      (pTVar1->isGeneric == false)))) {
    pMVar3 = (function->generics).head;
    bVar2 = pMVar3 != (MatchData *)0x0;
    if ((bVar2) && (pMVar3->type->isGeneric == false)) {
      do {
        pMVar3 = pMVar3->next;
        bVar2 = pMVar3 != (MatchData *)0x0;
        if (pMVar3 == (MatchData *)0x0) {
          return bVar2;
        }
      } while (pMVar3->type->isGeneric != true);
    }
  }
  return bVar2;
}

Assistant:

bool ExpressionContext::IsGenericFunction(FunctionData *function)
{
	if(function->type->isGeneric)
		return true;

	if(function->scope->ownerType && function->scope->ownerType->isGeneric)
		return true;

	for(MatchData *curr = function->generics.head; curr; curr = curr->next)
	{
		if(curr->type->isGeneric)
			return true;
	}

	return false;
}